

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# opennurbs_mesh.cpp
# Opt level: O3

ON_MappingTag * __thiscall
ON_SurfaceCurvatureColorMapping::ColorMappingTag
          (ON_MappingTag *__return_storage_ptr__,ON_SurfaceCurvatureColorMapping *this)

{
  bool bVar1;
  ON__UINT32 OVar2;
  long lVar3;
  ON_Xform *pOVar4;
  ON_Xform *pOVar5;
  byte bVar6;
  
  bVar6 = 0;
  memcpy(__return_storage_ptr__,&ON_MappingTag::Unset,0x98);
  bVar1 = IsSet(this);
  if (bVar1) {
    (__return_storage_ptr__->m_mapping_id).Data1 = 0x639e9144;
    (__return_storage_ptr__->m_mapping_id).Data2 = 0x1c1a;
    (__return_storage_ptr__->m_mapping_id).Data3 = 0x4bba;
    (__return_storage_ptr__->m_mapping_id).Data4[0] = 0x82;
    (__return_storage_ptr__->m_mapping_id).Data4[1] = 'H';
    (__return_storage_ptr__->m_mapping_id).Data4[2] = 0xd3;
    (__return_storage_ptr__->m_mapping_id).Data4[3] = '0';
    (__return_storage_ptr__->m_mapping_id).Data4[4] = 0xf5;
    (__return_storage_ptr__->m_mapping_id).Data4[5] = '\r';
    (__return_storage_ptr__->m_mapping_id).Data4[6] = '{';
    (__return_storage_ptr__->m_mapping_id).Data4[7] = 'i';
    __return_storage_ptr__->m_mapping_type = false_colors;
    OVar2 = CRC32(this);
    __return_storage_ptr__->m_mapping_crc = OVar2;
    pOVar4 = &ON_Xform::IdentityTransformation;
    pOVar5 = &__return_storage_ptr__->m_mesh_xform;
    for (lVar3 = 0x10; lVar3 != 0; lVar3 = lVar3 + -1) {
      pOVar5->m_xform[0][0] = pOVar4->m_xform[0][0];
      pOVar4 = (ON_Xform *)((long)pOVar4 + ((ulong)bVar6 * -2 + 1) * 8);
      pOVar5 = (ON_Xform *)((long)pOVar5 + (ulong)bVar6 * -0x10 + 8);
    }
  }
  return __return_storage_ptr__;
}

Assistant:

const ON_MappingTag ON_SurfaceCurvatureColorMapping::ColorMappingTag() const
{
  ON_MappingTag mt = ON_MappingTag::Unset;
  if (this->IsSet())
  {

    mt.m_mapping_id = ON_SurfaceCurvatureColorMapping::Id;
    mt.m_mapping_type = ON_TextureMapping::TYPE::false_colors;

    // DO NOT INCLUDE anything in the crc that does not directly control vertex colors.
    // This value is used to determine when the parameters used to calculate the vertex
    // colors have changed.
    mt.m_mapping_crc = this->CRC32();

    // The m_mesh_xform in meaningless for false color curvature analysis,
    // but setting it to the identity greases the wheels when downstream
    // code looks at it for unknown reasons.
    mt.m_mesh_xform = ON_Xform::IdentityTransformation;
  }

  return mt;
}